

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# plurfmt.cpp
# Opt level: O1

int32_t icu_63::PluralFormat::findSubMessage
                  (MessagePattern *pattern,int32_t partIndex,PluralSelector *selector,void *context,
                  double number,UErrorCode *ec)

{
  int iVar1;
  uint uVar2;
  Part *pPVar3;
  UBool UVar4;
  byte bVar5;
  int iVar6;
  uint uVar7;
  undefined4 uVar8;
  undefined8 uVar9;
  int iVar10;
  uint uVar11;
  uint uVar12;
  bool bVar13;
  double dVar14;
  UnicodeString keyword;
  UnicodeString other;
  double local_140;
  ConstChar16Ptr local_128;
  double local_120;
  PluralSelector *local_118;
  void *local_110;
  UErrorCode *local_108;
  char16_t *local_100;
  UnicodeString local_f0;
  UnicodeString local_b0;
  UnicodeString local_70;
  
  uVar7 = 0;
  if (*ec < U_ILLEGAL_ARGUMENT_ERROR) {
    iVar1 = pattern->partsLength;
    local_110 = context;
    local_108 = ec;
    if ((pattern->parts[partIndex].type & ~UMSGPAT_PART_TYPE_MSG_LIMIT) == UMSGPAT_PART_TYPE_ARG_INT
       ) {
      local_140 = MessagePattern::getNumericValue(pattern,pattern->parts + partIndex);
      partIndex = partIndex + 1;
    }
    else {
      local_140 = 0.0;
    }
    local_f0.super_Replaceable.super_UObject._vptr_UObject = (UObject)&PTR__UnicodeString_003e7ab8;
    local_f0.fUnion.fStackFields.fLengthAndFlags = 2;
    local_128.p_ = (char16_t *)OTHER_STRING;
    local_118 = selector;
    UnicodeString::UnicodeString(&local_b0,'\0',&local_128,5);
    local_100 = local_128.p_;
    local_120 = number - local_140;
    bVar13 = false;
    uVar7 = 0;
    do {
      uVar11 = partIndex + 1;
      pPVar3 = pattern->parts;
      iVar6 = 2;
      uVar12 = uVar11;
      if (pPVar3[partIndex].type == UMSGPAT_PART_TYPE_ARG_LIMIT) {
LAB_00274f86:
        uVar11 = (uint)selector;
      }
      else {
        if ((pPVar3[(int)uVar11].type & ~UMSGPAT_PART_TYPE_MSG_LIMIT) != UMSGPAT_PART_TYPE_ARG_INT)
        {
          if (bVar13) {
LAB_00274f67:
            bVar13 = true;
          }
          else {
            UVar4 = MessagePattern::partSubstringMatches(pattern,pPVar3 + partIndex,&local_b0);
            if (UVar4 == '\0') {
              if ((ushort)local_f0.fUnion.fStackFields.fLengthAndFlags < 0x20) {
                (*local_118->_vptr_PluralSelector[2])
                          (local_120,&local_70,local_118,local_110,local_108);
                UnicodeString::moveFrom(&local_f0,&local_70);
                UnicodeString::~UnicodeString(&local_70);
                if (uVar7 != 0) {
                  if ((local_b0.fUnion.fStackFields.fLengthAndFlags & 1U) == 0) {
                    uVar8 = local_b0.fUnion.fFields.fLength;
                    if (-1 < local_b0.fUnion.fStackFields.fLengthAndFlags) {
                      uVar8 = (int)local_b0.fUnion.fStackFields.fLengthAndFlags >> 5;
                    }
                    iVar6 = 0;
                    if ((int)uVar8 < 0) {
                      iVar6 = uVar8;
                    }
                    iVar10 = uVar8 - iVar6;
                    if ((int)uVar8 <= uVar8 - iVar6) {
                      iVar10 = uVar8;
                    }
                    if ((int)uVar8 < 0) {
                      iVar10 = 0;
                    }
                    uVar8 = local_f0.fUnion.fFields.fLength;
                    if (-1 < local_f0.fUnion.fStackFields.fLengthAndFlags) {
                      uVar8 = (int)local_f0.fUnion.fStackFields.fLengthAndFlags >> 5;
                    }
                    uVar9 = local_b0.fUnion.fStackFields.fBuffer;
                    if ((local_b0.fUnion.fStackFields.fLengthAndFlags & 2U) == 0) {
                      uVar9 = local_b0.fUnion.fFields.fArray;
                    }
                    bVar5 = UnicodeString::doCompare(&local_f0,0,uVar8,(UChar *)uVar9,iVar6,iVar10);
                  }
                  else {
                    bVar5 = ~(byte)local_f0.fUnion.fStackFields.fLengthAndFlags & 1;
                  }
                  if (bVar5 == 0) goto LAB_00274f67;
                }
              }
              UVar4 = MessagePattern::partSubstringMatches(pattern,pPVar3 + partIndex,&local_f0);
              bVar13 = UVar4 != '\0';
              if (bVar13) {
                uVar7 = uVar11;
              }
            }
            else if (uVar7 == 0) {
              if ((local_b0.fUnion.fStackFields.fLengthAndFlags & 1U) == 0) {
                uVar8 = local_b0.fUnion.fFields.fLength;
                if (-1 < local_b0.fUnion.fStackFields.fLengthAndFlags) {
                  uVar8 = (int)local_b0.fUnion.fStackFields.fLengthAndFlags >> 5;
                }
                iVar6 = 0;
                if ((int)uVar8 < 0) {
                  iVar6 = uVar8;
                }
                iVar10 = uVar8 - iVar6;
                if ((int)uVar8 <= uVar8 - iVar6) {
                  iVar10 = uVar8;
                }
                if ((int)uVar8 < 0) {
                  iVar10 = 0;
                }
                uVar8 = local_f0.fUnion.fFields.fLength;
                if (-1 < local_f0.fUnion.fStackFields.fLengthAndFlags) {
                  uVar8 = (int)local_f0.fUnion.fStackFields.fLengthAndFlags >> 5;
                }
                uVar9 = local_b0.fUnion.fStackFields.fBuffer;
                if ((local_b0.fUnion.fStackFields.fLengthAndFlags & 2U) == 0) {
                  uVar9 = local_b0.fUnion.fFields.fArray;
                }
                bVar5 = UnicodeString::doCompare(&local_f0,0,uVar8,(UChar *)uVar9,iVar6,iVar10);
              }
              else {
                bVar5 = ~(byte)local_f0.fUnion.fStackFields.fLengthAndFlags & 1;
              }
              bVar13 = bVar5 == 0;
              uVar7 = uVar11;
            }
            else {
              bVar13 = false;
            }
          }
LAB_00274f6a:
          uVar2 = pattern->parts[(int)uVar11].limitPartIndex;
          uVar12 = uVar11;
          if ((int)uVar11 < (int)uVar2) {
            uVar12 = uVar2;
          }
          iVar6 = 0;
          goto LAB_00274f86;
        }
        dVar14 = MessagePattern::getNumericValue(pattern,pPVar3 + (int)uVar11);
        uVar11 = partIndex + 2;
        iVar6 = 1;
        if ((dVar14 != number) || (uVar12 = uVar11, NAN(dVar14) || NAN(number))) goto LAB_00274f6a;
      }
      if (iVar6 != 0) {
        if (iVar6 != 2) {
          uVar7 = uVar11;
        }
        break;
      }
      partIndex = uVar12 + 1;
      selector = (PluralSelector *)(ulong)uVar11;
    } while (partIndex < iVar1);
    UnicodeString::~UnicodeString(&local_b0);
    UnicodeString::~UnicodeString(&local_f0);
  }
  return uVar7;
}

Assistant:

int32_t PluralFormat::findSubMessage(const MessagePattern& pattern, int32_t partIndex,
                                     const PluralSelector& selector, void *context,
                                     double number, UErrorCode& ec) {
    if (U_FAILURE(ec)) {
        return 0;
    }
    int32_t count=pattern.countParts();
    double offset;
    const MessagePattern::Part* part=&pattern.getPart(partIndex);
    if (MessagePattern::Part::hasNumericValue(part->getType())) {
        offset=pattern.getNumericValue(*part);
        ++partIndex;
    } else {
        offset=0;
    }
    // The keyword is empty until we need to match against a non-explicit, not-"other" value.
    // Then we get the keyword from the selector.
    // (In other words, we never call the selector if we match against an explicit value,
    // or if the only non-explicit keyword is "other".)
    UnicodeString keyword;
    UnicodeString other(FALSE, OTHER_STRING, 5);
    // When we find a match, we set msgStart>0 and also set this boolean to true
    // to avoid matching the keyword again (duplicates are allowed)
    // while we continue to look for an explicit-value match.
    UBool haveKeywordMatch=FALSE;
    // msgStart is 0 until we find any appropriate sub-message.
    // We remember the first "other" sub-message if we have not seen any
    // appropriate sub-message before.
    // We remember the first matching-keyword sub-message if we have not seen
    // one of those before.
    // (The parser allows [does not check for] duplicate keywords.
    // We just have to make sure to take the first one.)
    // We avoid matching the keyword twice by also setting haveKeywordMatch=true
    // at the first keyword match.
    // We keep going until we find an explicit-value match or reach the end of the plural style.
    int32_t msgStart=0;
    // Iterate over (ARG_SELECTOR [ARG_INT|ARG_DOUBLE] message) tuples
    // until ARG_LIMIT or end of plural-only pattern.
    do {
        part=&pattern.getPart(partIndex++);
        const UMessagePatternPartType type = part->getType();
        if(type==UMSGPAT_PART_TYPE_ARG_LIMIT) {
            break;
        }
        U_ASSERT (type==UMSGPAT_PART_TYPE_ARG_SELECTOR);
        // part is an ARG_SELECTOR followed by an optional explicit value, and then a message
        if(MessagePattern::Part::hasNumericValue(pattern.getPartType(partIndex))) {
            // explicit value like "=2"
            part=&pattern.getPart(partIndex++);
            if(number==pattern.getNumericValue(*part)) {
                // matches explicit value
                return partIndex;
            }
        } else if(!haveKeywordMatch) {
            // plural keyword like "few" or "other"
            // Compare "other" first and call the selector if this is not "other".
            if(pattern.partSubstringMatches(*part, other)) {
                if(msgStart==0) {
                    msgStart=partIndex;
                    if(0 == keyword.compare(other)) {
                        // This is the first "other" sub-message,
                        // and the selected keyword is also "other".
                        // Do not match "other" again.
                        haveKeywordMatch=TRUE;
                    }
                }
            } else {
                if(keyword.isEmpty()) {
                    keyword=selector.select(context, number-offset, ec);
                    if(msgStart!=0 && (0 == keyword.compare(other))) {
                        // We have already seen an "other" sub-message.
                        // Do not match "other" again.
                        haveKeywordMatch=TRUE;
                        // Skip keyword matching but do getLimitPartIndex().
                    }
                }
                if(!haveKeywordMatch && pattern.partSubstringMatches(*part, keyword)) {
                    // keyword matches
                    msgStart=partIndex;
                    // Do not match this keyword again.
                    haveKeywordMatch=TRUE;
                }
            }
        }
        partIndex=pattern.getLimitPartIndex(partIndex);
    } while(++partIndex<count);
    return msgStart;
}